

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary.cc
# Opt level: O3

void __thiscall
ctemplate::TemplateDictionary::DictionaryPrinter::DumpGlobals(DictionaryPrinter *this)

{
  int *piVar1;
  _Rb_tree_header *p_Var2;
  long *plVar3;
  _Base_ptr p_Var4;
  long *plVar5;
  size_type *psVar6;
  long *local_340;
  long local_338;
  long local_330;
  long lStack_328;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  undefined1 *local_2a0 [2];
  undefined1 local_290 [16];
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  sorted_global_dict;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"global dictionary {\n","");
  local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
  local_1c0._M_string_length = 0;
  local_1c0.field_2._M_local_buf[0] = '\0';
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  local_1e0._M_string_length = 0;
  local_1e0.field_2._M_local_buf[0] = '\0';
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  local_b0._M_string_length = 0;
  local_b0.field_2._M_local_buf[0] = '\0';
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  IndentedWriter::Write
            (&this->writer_,&local_1a0,&local_1c0,&local_1e0,&local_50,&local_70,&local_90,&local_b0
            );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p);
  }
  if ((this->writer_).line_state_ == AT_BEGINNING) {
    piVar1 = &(this->writer_).current_indentation_;
    *piVar1 = *piVar1 + 2;
    p_Var2 = &sorted_global_dict._M_t._M_impl.super__Rb_tree_header;
    sorted_global_dict._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    sorted_global_dict._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    sorted_global_dict._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    sorted_global_dict._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
    sorted_global_dict._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
    FillSortedGlobalDictMap(this,&sorted_global_dict);
    if ((_Rb_tree_header *)sorted_global_dict._M_t._M_impl.super__Rb_tree_header._M_header._M_left
        != p_Var2) {
      p_Var4 = sorted_global_dict._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        local_2a0[0] = local_290;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_2a0,*(long *)(p_Var4 + 1),
                   (long)&(p_Var4[1]._M_parent)->_M_color + *(long *)(p_Var4 + 1));
        std::__cxx11::string::append((char *)local_2a0);
        plVar3 = (long *)std::__cxx11::string::_M_append((char *)local_2a0,*(ulong *)(p_Var4 + 2));
        local_340 = &local_330;
        plVar5 = plVar3 + 2;
        if ((long *)*plVar3 == plVar5) {
          local_330 = *plVar5;
          lStack_328 = plVar3[3];
        }
        else {
          local_330 = *plVar5;
          local_340 = (long *)*plVar3;
        }
        local_338 = plVar3[1];
        *plVar3 = (long)plVar5;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_340);
        psVar6 = (size_type *)(plVar3 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar3 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar6) {
          local_280.field_2._M_allocated_capacity = *psVar6;
          local_280.field_2._8_8_ = plVar3[3];
          local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
        }
        else {
          local_280.field_2._M_allocated_capacity = *psVar6;
          local_280._M_dataplus._M_p = (pointer)*plVar3;
        }
        local_280._M_string_length = plVar3[1];
        *plVar3 = (long)psVar6;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
        local_2c0._M_string_length = 0;
        local_2c0.field_2._M_local_buf[0] = '\0';
        local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
        local_2e0._M_string_length = 0;
        local_2e0.field_2._M_local_buf[0] = '\0';
        local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
        local_300._M_string_length = 0;
        local_300.field_2._M_local_buf[0] = '\0';
        local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
        local_320._M_string_length = 0;
        local_320.field_2._M_local_buf[0] = '\0';
        local_220._M_string_length = 0;
        local_220.field_2._M_local_buf[0] = '\0';
        local_240._M_string_length = 0;
        local_240.field_2._M_local_buf[0] = '\0';
        local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
        local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
        IndentedWriter::Write
                  (&this->writer_,&local_280,&local_2c0,&local_2e0,&local_300,&local_320,&local_220,
                   &local_240);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_240._M_dataplus._M_p != &local_240.field_2) {
          operator_delete(local_240._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220._M_dataplus._M_p != &local_220.field_2) {
          operator_delete(local_220._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_320._M_dataplus._M_p != &local_320.field_2) {
          operator_delete(local_320._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_300._M_dataplus._M_p != &local_300.field_2) {
          operator_delete(local_300._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
          operator_delete(local_2e0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
          operator_delete(local_2c0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280._M_dataplus._M_p != &local_280.field_2) {
          operator_delete(local_280._M_dataplus._M_p);
        }
        if (local_340 != &local_330) {
          operator_delete(local_340);
        }
        if (local_2a0[0] != local_290) {
          operator_delete(local_2a0[0]);
        }
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
      } while ((_Rb_tree_header *)p_Var4 != &sorted_global_dict._M_t._M_impl.super__Rb_tree_header);
    }
    IndentedWriter::Dedent(&this->writer_);
    local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"};\n","");
    local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
    local_200._M_string_length = 0;
    local_200.field_2._M_local_buf[0] = '\0';
    local_100._M_string_length = 0;
    local_100.field_2._M_local_buf[0] = '\0';
    local_120._M_string_length = 0;
    local_120.field_2._M_local_buf[0] = '\0';
    local_140._M_string_length = 0;
    local_140.field_2._M_local_buf[0] = '\0';
    local_160._M_string_length = 0;
    local_160.field_2._M_local_buf[0] = '\0';
    local_180._M_string_length = 0;
    local_180.field_2._M_local_buf[0] = '\0';
    local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
    local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
    local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    IndentedWriter::Write
              (&this->writer_,&local_260,&local_200,&local_100,&local_120,&local_140,&local_160,
               &local_180);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._M_dataplus._M_p != &local_180.field_2) {
      operator_delete(local_180._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != &local_160.field_2) {
      operator_delete(local_160._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != &local_200.field_2) {
      operator_delete(local_200._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&sorted_global_dict._M_t);
    return;
  }
  __assert_fail("line_state_ == AT_BEGINNING",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/indented_writer.h"
                ,0x50,"void ctemplate::IndentedWriter::Indent()");
}

Assistant:

void DumpGlobals() {
    writer_.Write("global dictionary {\n");
    writer_.Indent();

    // We could be faster than converting every TemplateString into a
    // string and inserted into an ordered data structure, but why bother?
    map<string, string> sorted_global_dict;
    FillSortedGlobalDictMap(&sorted_global_dict);
    for (map<string, string>::const_iterator it = sorted_global_dict.begin();
         it != sorted_global_dict.end();  ++it) {
      writer_.Write(it->first + ": >" + it->second + "<\n");
    }

    writer_.Dedent();
    writer_.Write("};\n");
  }